

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O1

void __thiscall
testing::internal::FunctionMockerBase<void_(void_*,_unsigned_long)>::~FunctionMockerBase
          (FunctionMockerBase<void_(void_*,_unsigned_long)> *this)

{
  UntypedFunctionMockerBase *unaff_RBX;
  
  (this->super_UntypedFunctionMockerBase)._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_001a8c78;
  MutexBase::Lock((MutexBase *)g_gmock_mutex);
  UntypedFunctionMockerBase::VerifyAndClearExpectationsLocked
            (&this->super_UntypedFunctionMockerBase);
  Mock::UnregisterLocked(unaff_RBX);
  (*(this->super_UntypedFunctionMockerBase)._vptr_UntypedFunctionMockerBase[2])(this);
  MutexBase::Unlock((MutexBase *)g_gmock_mutex);
  (this->current_spec_).matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<void_*>,_testing::Matcher<unsigned_long>_>.
  super__Head_base<0UL,_testing::Matcher<void_*>,_false>._M_head_impl.super_MatcherBase<void_*>.
  _vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_001a8d10;
  linked_ptr<const_testing::MatcherInterface<void_*>_>::~linked_ptr
            (&(this->current_spec_).matchers_.
              super__Tuple_impl<0UL,_testing::Matcher<void_*>,_testing::Matcher<unsigned_long>_>.
              super__Head_base<0UL,_testing::Matcher<void_*>,_false>._M_head_impl.
              super_MatcherBase<void_*>.impl_);
  (this->current_spec_).matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<void_*>,_testing::Matcher<unsigned_long>_>.
  super__Tuple_impl<1UL,_testing::Matcher<unsigned_long>_>.
  super__Head_base<1UL,_testing::Matcher<unsigned_long>,_false>._M_head_impl.
  super_MatcherBase<unsigned_long>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_001a8ab8;
  linked_ptr<const_testing::MatcherInterface<unsigned_long>_>::~linked_ptr
            (&(this->current_spec_).matchers_.
              super__Tuple_impl<0UL,_testing::Matcher<void_*>,_testing::Matcher<unsigned_long>_>.
              super__Tuple_impl<1UL,_testing::Matcher<unsigned_long>_>.
              super__Head_base<1UL,_testing::Matcher<unsigned_long>,_false>._M_head_impl.
              super_MatcherBase<unsigned_long>.impl_);
  UntypedFunctionMockerBase::~UntypedFunctionMockerBase(&this->super_UntypedFunctionMockerBase);
  return;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
    MutexLock l(&g_gmock_mutex);
    VerifyAndClearExpectationsLocked();
    Mock::UnregisterLocked(this);
    ClearDefaultActionsLocked();
  }